

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::save(Args *this,ostream *out)

{
  char *in_RSI;
  long in_RDI;
  
  std::ostream::write(in_RSI,in_RDI + 0x6c);
  std::ostream::write(in_RSI,in_RDI + 0x70);
  std::ostream::write(in_RSI,in_RDI + 0x74);
  std::ostream::write(in_RSI,in_RDI + 0x78);
  std::ostream::write(in_RSI,in_RDI + 0x80);
  std::ostream::write(in_RSI,in_RDI + 0x84);
  std::ostream::write(in_RSI,in_RDI + 0x88);
  std::ostream::write(in_RSI,in_RDI + 0x8c);
  std::ostream::write(in_RSI,in_RDI + 0x90);
  std::ostream::write(in_RSI,in_RDI + 0x94);
  std::ostream::write(in_RSI,in_RDI + 0x98);
  std::ostream::write(in_RSI,in_RDI + 0x68);
  std::ostream::write(in_RSI,in_RDI + 0xa0);
  return;
}

Assistant:

void Args::save(std::ostream& out) {
  out.write((char*)&(dim), sizeof(int));
  out.write((char*)&(ws), sizeof(int));
  out.write((char*)&(epoch), sizeof(int));
  out.write((char*)&(minCount), sizeof(int));
  out.write((char*)&(neg), sizeof(int));
  out.write((char*)&(wordNgrams), sizeof(int));
  out.write((char*)&(loss), sizeof(loss_name));
  out.write((char*)&(model), sizeof(model_name));
  out.write((char*)&(bucket), sizeof(int));
  out.write((char*)&(minn), sizeof(int));
  out.write((char*)&(maxn), sizeof(int));
  out.write((char*)&(lrUpdateRate), sizeof(int));
  out.write((char*)&(t), sizeof(double));
}